

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O2

void Mio_SopPushSCC(Vec_Int_t *p,uint c)

{
  uint uVar1;
  ulong uVar2;
  uint i;
  uint uVar3;
  
  i = 0;
  uVar3 = 0;
  while( true ) {
    if (p->nSize <= (int)i) {
      if ((int)uVar3 <= p->nSize) {
        p->nSize = uVar3;
        Vec_IntPush(p,c);
        return;
      }
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    uVar1 = Vec_IntEntry(p,i);
    if ((uVar1 | c) == c) break;
    if ((uVar1 | c) != uVar1) {
      if (((int)uVar3 < 0) || (p->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      uVar2 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
      p->pArray[uVar2] = uVar1;
    }
    i = i + 1;
  }
  if (i == uVar3) {
    return;
  }
  __assert_fail("i == k",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mio/mioSop.c"
                ,0x3c,"void Mio_SopPushSCC(Vec_Int_t *, unsigned int)");
}

Assistant:

void Mio_SopPushSCC( Vec_Int_t * p, unsigned c )
{
    unsigned Entry;
    int i, k = 0;
    Vec_IntForEachEntry( p, Entry, i )
    {
        if ( Mio_CubeContains( Entry, c ) ) // Entry contains c
        {
            assert( i == k );
            return;
        }
        if ( Mio_CubeContains( c, Entry ) ) // c contains Entry
            continue;
        Vec_IntWriteEntry( p, k++, Entry );
    }
    Vec_IntShrink( p, k );
    Vec_IntPush( p, c );
}